

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_TestAllFieldsAreReturnInFidSequenceOrderEvenWhenAddedInADifferentOrder_Test
::
~ExtendedDataDictionaryTest_TestAllFieldsAreReturnInFidSequenceOrderEvenWhenAddedInADifferentOrder_Test
          (ExtendedDataDictionaryTest_TestAllFieldsAreReturnInFidSequenceOrderEvenWhenAddedInADifferentOrder_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExtendedDataDictionaryTest,
     TestAllFieldsAreReturnInFidSequenceOrderEvenWhenAddedInADifferentOrder)
{
    ExtendableDataDictionary data_dictionary = ExtendableDataDictionary();
    data_dictionary.AddFieldDef(ask2);
    data_dictionary.AddFieldDef(bid_size2);
    data_dictionary.AddFieldDef(status2);
    data_dictionary.AddFieldDef(bid2);
    data_dictionary.AddFieldDef(ask_size2);
    std::vector<FieldDef> actual = {bid2, ask2, bid_size2, ask_size2, status2};
    ASSERT_EQ(actual, data_dictionary.AllFieldDefs());
}